

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_copy.cpp
# Opt level: O2

void __thiscall
duckdb::Transformer::TransformCopyOptions
          (Transformer *this,CopyInfo *info,optional_ptr<duckdb_libpgquery::PGList,_true> options)

{
  bool bVar1;
  PGList *pPVar2;
  PGDefElem *pPVar3;
  PGValue *pPVar4;
  ParserException *this_00;
  allocator local_a1;
  string *local_a0;
  case_insensitive_map_t<vector<Value>_> *local_98;
  Transformer *local_90;
  optional_ptr<duckdb_libpgquery::PGValue,_true> format_val;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> def_elem;
  optional_ptr<duckdb_libpgquery::PGList,_true> options_local;
  string name;
  string local_50;
  
  if (options.ptr == (PGList *)0x0) {
    return;
  }
  local_90 = this;
  options_local = options;
  pPVar2 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&options_local);
  local_98 = &info->options;
  local_a0 = (string *)&info->format;
  while( true ) {
    while( true ) {
      pPVar2 = (PGList *)pPVar2->head;
      if (pPVar2 == (PGList *)0x0) {
        return;
      }
      def_elem.ptr = *(PGDefElem **)pPVar2;
      pPVar3 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
      ::std::__cxx11::string::string((string *)&local_50,pPVar3->defname,(allocator *)&format_val);
      StringUtil::Lower(&name,&local_50);
      bVar1 = ::std::operator==(&name,"format");
      ::std::__cxx11::string::~string((string *)&name);
      ::std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) break;
      pPVar3 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
      ::std::__cxx11::string::string((string *)&name,pPVar3->defname,(allocator *)&local_50);
      pPVar3 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
      ParseGenericOptionListEntry(local_90,local_98,&name,pPVar3->arg);
      ::std::__cxx11::string::~string((string *)&name);
    }
    pPVar3 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
    format_val.ptr = (PGValue *)pPVar3->arg;
    if ((format_val.ptr == (PGValue *)0x0) ||
       (pPVar4 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&format_val),
       pPVar4->type != T_PGString)) break;
    pPVar4 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&format_val);
    ::std::__cxx11::string::string((string *)&local_50,(pPVar4->val).str,&local_a1);
    StringUtil::Lower(&name,&local_50);
    ::std::__cxx11::string::operator=(local_a0,(string *)&name);
    ::std::__cxx11::string::~string((string *)&name);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  this_00 = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&name,
             "Unsupported parameter type for FORMAT: expected e.g. FORMAT \'csv\', \'parquet\'",
             (allocator *)&local_50);
  ParserException::ParserException(this_00,&name);
  __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Transformer::TransformCopyOptions(CopyInfo &info, optional_ptr<duckdb_libpgquery::PGList> options) {
	if (!options) {
		return;
	}

	duckdb_libpgquery::PGListCell *cell;
	// iterate over each option
	for_each_cell(cell, options->head) {
		auto def_elem = PGPointerCast<duckdb_libpgquery::PGDefElem>(cell->data.ptr_value);
		if (StringUtil::Lower(def_elem->defname) == "format") {
			// format specifier: interpret this option
			auto format_val = PGPointerCast<duckdb_libpgquery::PGValue>(def_elem->arg);
			if (!format_val || format_val->type != duckdb_libpgquery::T_PGString) {
				throw ParserException("Unsupported parameter type for FORMAT: expected e.g. FORMAT 'csv', 'parquet'");
			}
			info.format = StringUtil::Lower(format_val->val.str);
			continue;
		}

		// The rest ends up in the options
		string name = def_elem->defname;
		ParseGenericOptionListEntry(info.options, name, def_elem->arg);
	}
}